

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

bool Cipher::mutateClusters(TParameters *params,TClusters *clusters)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  
  piVar1 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar2 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar3 = rand();
  iVar4 = rand();
  (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar3 % (int)((ulong)((long)piVar1 - (long)piVar2) >> 2)] = iVar4 % params->maxClusters;
  return true;
}

Assistant:

bool mutateClusters(const TParameters & params, TClusters & clusters) {
        int n = clusters.size();

        //for (int i = 0; i < 3; ++i) {
        //    int i0 = rand()%n;
        //    int i1 = rand()%n;
        //    std::swap(clusters[i0], clusters[i1]);
        //}

        for (int i = 0; i < 1; ++i) {
            int idx = rand()%n;
            clusters[idx] = rand()%params.maxClusters;
            //auto p = clusters[idx];
            //while (clusters[idx] == p) {
            //    clusters[idx] = rand()%params.maxClusters;
            //}
        }

        //std::map<int, bool> used;
        //for (int i = 0; i < n; ++i) {
        //    if (hint[i] < 0) continue;
        //    clusters[i] = hint[i];
        //    used[hint[i]] = true;
        //}

        return true;
    }